

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::bt_peer_connection::on_connected(bt_peer_connection *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *this_00;
  socket_type *s;
  long lVar4;
  uint local_a8;
  torrent_peer *pi;
  int policy_name_idx;
  uint8_t out_policy;
  cork c_;
  error_code local_50 [2];
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  bt_peer_connection *this_local;
  undefined4 extraout_var;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  uVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((uVar2 & 1) != 0) {
    return;
  }
  peer_connection::associated_torrent((peer_connection *)local_30);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_20);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)local_30);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_20);
  bVar1 = torrent::graceful_pause(this_00);
  if (bVar1) {
    peer_connection::peer_log(&this->super_peer_connection,info,"ON_CONNECTED","graceful-paused");
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (local_50,torrent_paused,(type *)0x0);
    c_._15_1_ = 0;
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,local_50,1,0);
    c_.m_need_uncork = true;
    c_._9_3_ = 0;
    goto LAB_0022967e;
  }
  cork::cork((cork *)&policy_name_idx,&this->super_peer_connection);
  iVar3 = session_settings::get_int
                    ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                     0x4076);
  pi._7_1_ = (byte)iVar3;
  s = peer_connection::get_socket(&this->super_peer_connection);
  bVar1 = is_ssl(s);
  if (bVar1) {
    pi._7_1_ = 2;
  }
  if (pi._7_1_ < 4) {
    local_a8 = (uint)pi._7_1_;
  }
  else {
    local_a8 = 3;
  }
  peer_connection::peer_log
            (&this->super_peer_connection,info,"ENCRYPTION","outgoing encryption policy: %s",
             on_connected::policy_name[(int)local_a8]);
  if (pi._7_1_ == 0) {
    write_pe1_2_dhkey(this);
    uVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
    if ((uVar2 & 1) == 0) {
      (this->super_peer_connection).field_0x888 = 0;
      crypto_receive_buffer::reset(&this->m_recv_buffer,0x60);
      peer_connection::setup_receive(&this->super_peer_connection);
      goto LAB_0022966e;
    }
    c_.m_need_uncork = true;
    c_._9_3_ = 0;
  }
  else {
    if (pi._7_1_ == 1) {
      iVar3 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])();
      lVar4 = CONCAT44(extraout_var,iVar3);
      if ((*(uint *)(lVar4 + 0x1b) >> 0x17 & 1) == 1) {
        *(uint *)(lVar4 + 0x1b) = *(uint *)(lVar4 + 0x1b) & 0xff7fffff;
        peer_connection::fast_reconnect(&this->super_peer_connection,true);
        write_pe1_2_dhkey(this);
        uVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
        if ((uVar2 & 1) != 0) {
          c_.m_need_uncork = true;
          c_._9_3_ = 0;
          goto LAB_00229675;
        }
        (this->super_peer_connection).field_0x888 = 0;
        crypto_receive_buffer::reset(&this->m_recv_buffer,0x60);
        peer_connection::setup_receive(&this->super_peer_connection);
      }
      else {
        *(uint *)(lVar4 + 0x1b) = *(uint *)(lVar4 + 0x1b) | 0x800000;
        write_handshake(this);
        crypto_receive_buffer::reset(&this->m_recv_buffer,0x14);
        peer_connection::setup_receive(&this->super_peer_connection);
      }
    }
    else {
      write_handshake(this);
      crypto_receive_buffer::reset(&this->m_recv_buffer,0x14);
      peer_connection::setup_receive(&this->super_peer_connection);
    }
LAB_0022966e:
    c_.m_need_uncork = false;
    c_._9_3_ = 0;
  }
LAB_00229675:
  cork::~cork((cork *)&policy_name_idx);
LAB_0022967e:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_20);
  return;
}

Assistant:

void bt_peer_connection::on_connected()
	{
		if (is_disconnecting()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		if (t->graceful_pause())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "ON_CONNECTED", "graceful-paused");
#endif
			disconnect(errors::torrent_paused, operation_t::bittorrent);
			return;
		}

		// make sure are much as possible of the response ends up in the same
		// packet, or at least back-to-back packets
		cork c_(*this);

#if !defined TORRENT_DISABLE_ENCRYPTION

		auto out_policy = static_cast<std::uint8_t>(m_settings.get_int(settings_pack::out_enc_policy));

#ifdef TORRENT_SSL_PEERS
		// never try an encrypted connection when already using SSL
		if (is_ssl(get_socket()))
			out_policy = settings_pack::pe_disabled;
#endif
#if TORRENT_USE_RTC
		// never try an encrypted connection over WebRTC (which is already encrypted)
		if (torrent_peer *pi = peer_info_struct())
			if (pi->is_rtc_addr)
				out_policy = settings_pack::pe_disabled;
#endif
#ifndef TORRENT_DISABLE_LOGGING
		static char const* policy_name[] = {"forced", "enabled", "disabled", "invalid-setting"};
		int const policy_name_idx = out_policy > 3 ? 3 : out_policy;
		peer_log(peer_log_alert::info, "ENCRYPTION"
			, "outgoing encryption policy: %s", policy_name[policy_name_idx]);
#endif

		if (out_policy == settings_pack::pe_forced)
		{
			write_pe1_2_dhkey();
			if (is_disconnecting()) return;

			m_state = state_t::read_pe_dhkey;
			m_recv_buffer.reset(dh_key_len);
			setup_receive();
		}
		else if (out_policy == settings_pack::pe_enabled)
		{
			TORRENT_ASSERT(peer_info_struct());

			torrent_peer* pi = peer_info_struct();
			if (pi->pe_support == true)
			{
				// toggle encryption support flag, toggled back to
				// true if encrypted portion of the handshake
				// completes correctly
				pi->pe_support = false;

				// if this fails, we need to reconnect
				// fast.
				fast_reconnect(true);

				write_pe1_2_dhkey();
				if (is_disconnecting()) return;
				m_state = state_t::read_pe_dhkey;
				m_recv_buffer.reset(dh_key_len);
				setup_receive();
			}
			else // pi->pe_support == false
			{
				// toggled back to false if standard handshake
				// completes correctly (without encryption)
				pi->pe_support = true;

				write_handshake();
				m_recv_buffer.reset(20);
				setup_receive();
			}
		}
		else
#endif
		{
#if !defined TORRENT_DISABLE_ENCRYPTION
			TORRENT_ASSERT(out_policy == settings_pack::pe_disabled);
#endif
			write_handshake();

			TORRENT_ASSERT(m_sent_handshake);
			// start in the state where we are trying to read the
			// handshake from the other side
			m_recv_buffer.reset(20);
			setup_receive();
		}
	}